

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

void Aig_TsiStop(Aig_Tsi_t *p)

{
  Aig_Tsi_t *p_local;
  
  Aig_MmFixedStop(p->pMem,0);
  Vec_PtrFree(p->vStates);
  if (p->pBins != (uint **)0x0) {
    free(p->pBins);
    p->pBins = (uint **)0x0;
  }
  if (p != (Aig_Tsi_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Aig_TsiStop( Aig_Tsi_t * p )
{
    Aig_MmFixedStop( p->pMem, 0 );
    Vec_PtrFree( p->vStates );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}